

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# experiment_helpers.cpp
# Opt level: O0

void opengv::printExperimentCharacteristics
               (translation_t *position,rotation_t *rotation,double noise,double outlierFraction)

{
  ostream *poVar1;
  void *pvVar2;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_00000228;
  ostream *in_stack_00000230;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"the random position is:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_00000230,
                             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_00000228);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"the random rotation is:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = Eigen::operator<<(in_stack_00000230,in_stack_00000228);
  pvVar2 = (void *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"the noise in the data is:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,in_XMM0_Qa);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,"the outlier fraction is:");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  pvVar2 = (void *)std::ostream::operator<<(&std::cout,in_XMM1_Qa);
  std::ostream::operator<<(pvVar2,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
opengv::printExperimentCharacteristics(
    const translation_t & position,
    const rotation_t & rotation,
    double noise,
    double outlierFraction )
{
  std::cout << "the random position is:" << std::endl;
  std::cout << position << std::endl << std::endl;
  std::cout << "the random rotation is:" << std::endl;
  std::cout << rotation << std::endl << std::endl;
  std::cout << "the noise in the data is:" << std::endl;
  std::cout << noise << std::endl;
  std::cout << "the outlier fraction is:" << std::endl;
  std::cout << outlierFraction << std::endl;
}